

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O3

int coda_product_definition_validate(coda_product_definition *product_definition)

{
  if ((product_definition->format < coda_format_xml) &&
     (product_definition->root_type == (coda_type *)0x0)) {
    coda_set_error(-400,"missing root type for product type version definition");
    return -1;
  }
  product_definition->initialized = 1;
  return 0;
}

Assistant:

int coda_product_definition_validate(coda_product_definition *product_definition)
{
    if (product_definition->format == coda_format_ascii || product_definition->format == coda_format_binary)
    {
        if (product_definition->root_type == NULL)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "missing root type for product type version definition");
            return -1;
        }
    }

    product_definition->initialized = 1;

    return 0;
}